

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O2

void __thiscall CVmTimeZone::~CVmTimeZone(CVmTimeZone *this)

{
  lib_free_str(this->name_);
  if (this->trans_ != (vmtz_trans *)0x0) {
    operator_delete__(this->trans_);
  }
  if (this->ttype_ != (vmtz_ttype *)0x0) {
    operator_delete__(this->ttype_);
  }
  if (this->rule_ != (vmtz_rule *)0x0) {
    operator_delete__(this->rule_);
  }
  if (this->abbr_ != (char *)0x0) {
    operator_delete__(this->abbr_);
  }
  if (this->desc_ != (char *)0x0) {
    operator_delete__(this->desc_);
    return;
  }
  return;
}

Assistant:

CVmTimeZone::~CVmTimeZone()
{
    /* delete allocated items */
    lib_free_str(name_);
    if (trans_ != 0)
        delete [] trans_;
    if (ttype_ != 0)
        delete [] ttype_;
    if (rule_ != 0)
        delete [] rule_;
    if (abbr_ != 0)
        delete [] abbr_;
    if (desc_ != 0)
        delete [] desc_;
}